

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

void __thiscall IR::MultiBranchInstr::ClearTarget(MultiBranchInstr *this)

{
  OpCode OVar1;
  Kind KVar2;
  LabelInstr *pLVar3;
  long *plVar4;
  long lVar5;
  code *pcVar6;
  bool bVar7;
  undefined4 *puVar8;
  char *message;
  long lVar9;
  char *error;
  uint lineNumber;
  char *pcVar10;
  ulong uVar11;
  int iVar12;
  long *plVar13;
  BranchDictionary *branchDictionary;
  
  pLVar3 = (this->super_BranchInstr).m_branchTarget;
  bVar7 = (this->super_BranchInstr).m_isMultiBranch;
  pcVar10 = (char *)this;
  if (pLVar3 == (LabelInstr *)0x0) {
    if (bVar7 == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      error = "(m_isMultiBranch)";
      message = "m_isMultiBranch";
      lineNumber = 0x20e;
      goto LAB_004bdf97;
    }
  }
  else if (bVar7 != false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    error = "(!m_isMultiBranch)";
    message = "!m_isMultiBranch";
    lineNumber = 0x209;
LAB_004bdf97:
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl";
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,lineNumber,error,message);
    if (!bVar7) goto LAB_004be0e6;
    *puVar8 = 0;
  }
  if (pLVar3 != (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    pcVar10 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp";
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0x700,"(IsMultiBranch())","IsMultiBranch()");
    if (!bVar7) {
LAB_004be0e6:
      pcVar6 = (code *)invalidInstructionException();
      (*pcVar6)();
    }
    *puVar8 = 0;
  }
  plVar4 = (long *)this->m_branchTargets;
  if (plVar4 != (long *)0x0) {
    KVar2 = this->m_kind;
    if ((KVar2 == IntJumpTable) || (KVar2 == SingleCharStrJumpTable)) {
      plVar13 = plVar4 + 1;
      lVar9 = this->m_baseCaseValue;
      if (lVar9 <= this->m_lastCaseValue) {
        lVar5 = *plVar4;
        do {
          pLVar3 = *(LabelInstr **)(lVar5 + this->m_baseCaseValue * -8 + lVar9 * 8);
          if (pLVar3 != (LabelInstr *)0x0) {
            LabelInstr::RemoveLabelRef(pLVar3,&this->super_BranchInstr);
          }
          lVar9 = lVar9 + 1;
        } while (lVar9 <= this->m_lastCaseValue);
      }
    }
    else {
      if (KVar2 != StrDictionary) {
        ClearTarget();
        OVar1 = (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode;
        if (OVar1 < BrHasSideEffects) {
          if (OVar1 < BrOnEmpty) {
            switch(OVar1) {
            case Br:
              return;
            case BrNotHasSideEffects:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                   BrHasSideEffects;
              return;
            case BrFncNeqApply:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrFncEqApply
              ;
              return;
            case BrEq_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotEq_A;
              return;
            case BrNeq_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotNeq_A;
              return;
            case BrFalse_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrTrue_A;
              return;
            case BrTrue_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrFalse_A;
              return;
            case BrGe_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotGe_A;
              return;
            case BrGt_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotGt_A;
              return;
            case BrLt_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotLt_A;
              return;
            case BrLe_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotLe_A;
              return;
            case BrSrEq_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrSrNotEq_A;
              return;
            case BrSrNeq_A:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrSrNotNeq_A
              ;
              return;
            case BrOnHasLocalProperty:
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnNoLocalProperty;
              return;
            }
          }
          else {
            if (OVar1 == BrOnEmpty) {
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrOnNotEmpty
              ;
              return;
            }
            if (OVar1 == BrOnHasProperty) {
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnNoProperty;
              return;
            }
            if (OVar1 == BrOnNoProperty) {
              (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                   BrOnHasProperty;
              return;
            }
          }
        }
        else if (OVar1 < BrOnNotEmpty) {
          switch(OVar1) {
          case BrHasSideEffects:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                 BrNotHasSideEffects;
            return;
          case BrFncEqApply:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrFncNeqApply;
            return;
          case BrUnGe_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnLt_A;
            return;
          case BrUnGt_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnLe_A;
            return;
          case BrUnLt_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnGe_A;
            return;
          case BrUnLe_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnGt_A;
            return;
          case BrOnNoLocalProperty:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                 BrOnHasLocalProperty;
            return;
          case BrNotEq_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrEq_A;
            return;
          case BrNotNeq_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNeq_A;
            return;
          case BrSrNotEq_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrSrEq_A;
            return;
          case BrSrNotNeq_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrSrNeq_A;
            return;
          case BrNotGe_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrGe_A;
            return;
          case BrNotGt_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrGt_A;
            return;
          case BrNotLt_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrLt_A;
            return;
          case BrNotLe_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrLe_A;
            return;
          case BrNotAddr_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrAddr_A;
            return;
          case BrAddr_A:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNotAddr_A;
            return;
          case BrOnException:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                 BrOnNoException;
            return;
          case BrEq_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrNeq_I4;
            return;
          case BrTrue_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrFalse_I4;
            return;
          case BrFalse_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrTrue_I4;
            return;
          case BrGe_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrLt_I4;
            return;
          case BrUnGe_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnLt_I4;
            return;
          case BrGt_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrLe_I4;
            return;
          case BrUnGt_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnLe_I4;
            return;
          case BrLt_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrGe_I4;
            return;
          case BrUnLt_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnGe_I4;
            return;
          case BrLe_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrGt_I4;
            return;
          case BrUnLe_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrUnGt_I4;
            return;
          case BrNeq_I4:
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrEq_I4;
            return;
          }
        }
        else {
          if (OVar1 == BrOnNotEmpty) {
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode = BrOnEmpty;
            return;
          }
          if (OVar1 == BrFncCachedScopeEq) {
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                 BrFncCachedScopeNeq;
            return;
          }
          if (OVar1 == BrFncCachedScopeNeq) {
            (((MultiBranchInstr *)pcVar10)->super_BranchInstr).super_Instr.m_opcode =
                 BrFncCachedScopeEq;
            return;
          }
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                           ,0x7e2,"((0))","Unhandled branch");
        if (bVar7) {
          *puVar8 = 0;
          return;
        }
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      plVar13 = plVar4 + 7;
      if (*(int *)((long)plVar4 + 0x1c) != 0) {
        uVar11 = 0;
        do {
          iVar12 = *(int *)(*plVar4 + uVar11 * 4);
          while (iVar12 != -1) {
            lVar9 = (long)iVar12;
            iVar12 = *(int *)(plVar4[1] + 8 + lVar9 * 0x18);
            pLVar3 = *(LabelInstr **)(plVar4[1] + lVar9 * 0x18);
            if (pLVar3 != (LabelInstr *)0x0) {
              LabelInstr::RemoveLabelRef(pLVar3,&this->super_BranchInstr);
            }
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < *(uint *)((long)plVar4 + 0x1c));
      }
    }
    if ((LabelInstr *)*plVar13 != (LabelInstr *)0x0) {
      LabelInstr::RemoveLabelRef((LabelInstr *)*plVar13,&this->super_BranchInstr);
    }
  }
  this->m_branchTargets = (void *)0x0;
  return;
}

Assistant:

void
MultiBranchInstr::ClearTarget()
{
    Assert(IsMultiBranch());

    MapMultiBrLabels([&](LabelInstr *const targetLabel)
    {
        ChangeLabelRef(targetLabel, nullptr);
    });
    m_branchTargets = nullptr;
}